

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plp.cc
# Opt level: O2

int main(int argc,char **argv)

{
  InputOutputFormats input_format;
  double dVar1;
  bool bVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  undefined8 uVar6;
  ostream *poVar7;
  ostringstream *this;
  double *energy_00;
  int read_size;
  char *pcVar8;
  uint uVar9;
  double dVar10;
  double sampling_rate_00;
  allocator local_835;
  int fft_length;
  InputOutputFormats local_830;
  int num_order;
  int liftering_coefficient;
  int num_channel;
  string local_820;
  ulong local_800;
  double highest_frequency;
  ulong local_7f0;
  double lowest_frequency;
  double floor;
  double sampling_rate;
  double compression_factor;
  ostringstream error_message_15;
  double energy;
  vector<double,_std::allocator<double>_> output;
  vector<double,_std::allocator<double>_> processed_input;
  vector<double,_std::allocator<double>_> input;
  ifstream ifs;
  byte abStack_5d8 [488];
  PerceptualLinearPredictiveCoefficientsAnalysis analysis;
  SpectrumToSpectrum spectrum_to_spectrum;
  WaveformToSpectrum waveform_to_spectrum;
  Buffer buffer_for_plp_analysis;
  Buffer buffer_for_spectral_analysis;
  
  num_channel = 0x14;
  num_order = 0xc;
  fft_length = 0x100;
  liftering_coefficient = 0x16;
  compression_factor = 0.33;
  lowest_frequency = 0.0;
  highest_frequency = 0.0;
  sampling_rate = 16.0;
  floor = 1.0;
  local_7f0 = 0;
  local_830 = kNumInputOutputFormats;
  local_800 = 0;
  do {
    iVar5 = ya_getopt_long(argc,argv,"n:m:l:c:f:s:L:H:q:o:e:h",(option *)0x0,(int *)0x0);
    input_format = local_830;
    switch(iVar5) {
    case 99:
      std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_15);
      bVar2 = sptk::ConvertStringToInteger((string *)&ifs,&liftering_coefficient);
      bVar3 = liftering_coefficient < 1;
      std::__cxx11::string::~string((string *)&ifs);
      if (!bVar2 || bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        std::operator<<((ostream *)&ifs,"The argument for the -c option must be a positive integer")
        ;
        std::__cxx11::string::string((string *)&error_message_15,"plp",(allocator *)&analysis);
        sptk::PrintErrorMessage((string *)&error_message_15,(ostringstream *)&ifs);
        goto LAB_00105182;
      }
      break;
    case 100:
    case 0x67:
    case 0x69:
    case 0x6a:
    case 0x6b:
    case 0x70:
    case 0x72:
switchD_00104844_caseD_64:
      anon_unknown.dwarf_2bf5::PrintUsage((ostream *)&std::cerr);
      return 1;
    case 0x65:
      std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_15);
      bVar2 = sptk::ConvertStringToDouble((string *)&ifs,&floor);
      bVar3 = floor <= 0.0;
      std::__cxx11::string::~string((string *)&ifs);
      if (!bVar2 || bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        std::operator<<((ostream *)&ifs,"The argument for the -e option must be a positive number");
        std::__cxx11::string::string((string *)&error_message_15,"plp",(allocator *)&analysis);
        sptk::PrintErrorMessage((string *)&error_message_15,(ostringstream *)&ifs);
        goto LAB_00105182;
      }
      break;
    case 0x66:
      std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_15);
      bVar2 = sptk::ConvertStringToDouble((string *)&ifs,&compression_factor);
      bVar3 = compression_factor <= 0.0;
      std::__cxx11::string::~string((string *)&ifs);
      if (!bVar2 || bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        std::operator<<((ostream *)&ifs,"The argument for the -f option must be a positive number");
        std::__cxx11::string::string((string *)&error_message_15,"plp",(allocator *)&analysis);
        sptk::PrintErrorMessage((string *)&error_message_15,(ostringstream *)&ifs);
        goto LAB_00105182;
      }
      break;
    case 0x68:
      anon_unknown.dwarf_2bf5::PrintUsage((ostream *)&std::cout);
      return 0;
    case 0x6c:
      std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_15);
      bVar3 = sptk::ConvertStringToInteger((string *)&ifs,&fft_length);
      std::__cxx11::string::~string((string *)&ifs);
      if (!bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        std::operator<<((ostream *)&ifs,"The argument for the -l option must be an integer");
        std::__cxx11::string::string((string *)&error_message_15,"plp",(allocator *)&analysis);
        sptk::PrintErrorMessage((string *)&error_message_15,(ostringstream *)&ifs);
        goto LAB_00105182;
      }
      break;
    case 0x6d:
      std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_15);
      bVar2 = sptk::ConvertStringToInteger((string *)&ifs,&num_order);
      bVar3 = num_order < 1;
      std::__cxx11::string::~string((string *)&ifs);
      if (!bVar2 || bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        std::operator<<((ostream *)&ifs,"The argument for the -m option must be a positive integer")
        ;
        std::__cxx11::string::string((string *)&error_message_15,"plp",(allocator *)&analysis);
        sptk::PrintErrorMessage((string *)&error_message_15,(ostringstream *)&ifs);
        goto LAB_00105182;
      }
      break;
    case 0x6e:
      std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_15);
      bVar2 = sptk::ConvertStringToInteger((string *)&ifs,&num_channel);
      bVar3 = num_channel < 1;
      std::__cxx11::string::~string((string *)&ifs);
      if (!bVar2 || bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        std::operator<<((ostream *)&ifs,"The argument for the -n option must be a positive integer")
        ;
        std::__cxx11::string::string((string *)&error_message_15,"plp",(allocator *)&analysis);
        sptk::PrintErrorMessage((string *)&error_message_15,(ostringstream *)&ifs);
        goto LAB_00105182;
      }
      break;
    case 0x6f:
      std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_15);
      bVar3 = sptk::ConvertStringToInteger((string *)&ifs,(int *)&analysis);
      if (bVar3) {
        bVar3 = sptk::IsInRange((InputOutputFormats)
                                analysis._vptr_PerceptualLinearPredictiveCoefficientsAnalysis,0,3);
        std::__cxx11::string::~string((string *)&ifs);
        if (bVar3) {
          local_7f0 = (ulong)(InputOutputFormats)
                             analysis._vptr_PerceptualLinearPredictiveCoefficientsAnalysis;
          break;
        }
      }
      else {
        std::__cxx11::string::~string((string *)&ifs);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
      poVar7 = std::operator<<((ostream *)&ifs,"The argument for the -o option must be an integer ")
      ;
      poVar7 = std::operator<<(poVar7,"in the range of ");
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0);
      poVar7 = std::operator<<(poVar7," to ");
      std::ostream::operator<<((ostream *)poVar7,3);
      std::__cxx11::string::string
                ((string *)&error_message_15,"plp",(allocator *)&waveform_to_spectrum);
      sptk::PrintErrorMessage((string *)&error_message_15,(ostringstream *)&ifs);
      goto LAB_00105182;
    case 0x71:
      std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_15);
      bVar3 = sptk::ConvertStringToInteger((string *)&ifs,(int *)&analysis);
      if (bVar3) {
        bVar3 = sptk::IsInRange((InputOutputFormats)
                                analysis._vptr_PerceptualLinearPredictiveCoefficientsAnalysis,0,4);
        std::__cxx11::string::~string((string *)&ifs);
        if (bVar3) {
          local_830 = (InputOutputFormats)
                      analysis._vptr_PerceptualLinearPredictiveCoefficientsAnalysis;
          break;
        }
      }
      else {
        std::__cxx11::string::~string((string *)&ifs);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
      poVar7 = std::operator<<((ostream *)&ifs,"The argument for the -q option must be an integer ")
      ;
      poVar7 = std::operator<<(poVar7,"in the range of ");
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0);
      poVar7 = std::operator<<(poVar7," to ");
      std::ostream::operator<<((ostream *)poVar7,4);
      std::__cxx11::string::string
                ((string *)&error_message_15,"plp",(allocator *)&waveform_to_spectrum);
      sptk::PrintErrorMessage((string *)&error_message_15,(ostringstream *)&ifs);
      goto LAB_00105182;
    case 0x73:
      std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_15);
      bVar2 = sptk::ConvertStringToDouble((string *)&ifs,&sampling_rate);
      bVar3 = sampling_rate <= 0.0;
      std::__cxx11::string::~string((string *)&ifs);
      if (!bVar2 || bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        std::operator<<((ostream *)&ifs,"The argument for the -s option must be a positive number");
        std::__cxx11::string::string((string *)&error_message_15,"plp",(allocator *)&analysis);
        sptk::PrintErrorMessage((string *)&error_message_15,(ostringstream *)&ifs);
        goto LAB_00105182;
      }
      break;
    default:
      if (iVar5 == 0x48) {
        std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_15);
        bVar2 = sptk::ConvertStringToDouble((string *)&ifs,&highest_frequency);
        bVar3 = highest_frequency <= 0.0;
        uVar6 = std::__cxx11::string::~string((string *)&ifs);
        local_800 = CONCAT71((int7)((ulong)uVar6 >> 8),1);
        if (!bVar2 || bVar3) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
          std::operator<<((ostream *)&ifs,"The argument for the -H option must be a positive number"
                         );
          std::__cxx11::string::string((string *)&error_message_15,"plp",(allocator *)&analysis);
          sptk::PrintErrorMessage((string *)&error_message_15,(ostringstream *)&ifs);
LAB_00105182:
          std::__cxx11::string::~string((string *)&error_message_15);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ifs);
          return 1;
        }
      }
      else {
        if (iVar5 != 0x4c) {
          if (iVar5 != -1) goto switchD_00104844_caseD_64;
          sampling_rate_00 = sampling_rate * 1000.0;
          dVar10 = sampling_rate_00 * 0.5;
          dVar1 = dVar10;
          if (((local_800 & 1) != 0) && (dVar1 = highest_frequency, dVar10 < highest_frequency)) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
            std::operator<<((ostream *)&ifs,
                            "Highest frequency must be less than or equal to Nyquist frequency");
            std::__cxx11::string::string((string *)&error_message_15,"plp",(allocator *)&analysis);
            sptk::PrintErrorMessage((string *)&error_message_15,(ostringstream *)&ifs);
            goto LAB_00105182;
          }
          highest_frequency = dVar1;
          if (highest_frequency <= lowest_frequency) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
            std::operator<<((ostream *)&ifs,"Lowest frequency must be less than highest one");
            std::__cxx11::string::string((string *)&error_message_15,"plp",(allocator *)&analysis);
            sptk::PrintErrorMessage((string *)&error_message_15,(ostringstream *)&ifs);
            goto LAB_00105182;
          }
          if (1 < argc - ya_optind) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
            std::operator<<((ostream *)&ifs,"Too many input files");
            std::__cxx11::string::string((string *)&error_message_15,"plp",(allocator *)&analysis);
            sptk::PrintErrorMessage((string *)&error_message_15,(ostringstream *)&ifs);
            goto LAB_00105182;
          }
          if (argc == ya_optind) {
            pcVar8 = (char *)0x0;
          }
          else {
            pcVar8 = argv[ya_optind];
          }
          bVar3 = sptk::SetBinaryMode();
          this = (ostringstream *)&ifs;
          if (!bVar3) {
            std::__cxx11::ostringstream::ostringstream(this);
            std::operator<<((ostream *)this,"Cannot set translation mode");
            std::__cxx11::string::string((string *)&error_message_15,"plp",(allocator *)&analysis);
            sptk::PrintErrorMessage((string *)&error_message_15,(ostringstream *)&ifs);
            goto LAB_00105182;
          }
          std::ifstream::ifstream(this);
          if ((pcVar8 != (char *)0x0) &&
             (std::ifstream::open((char *)&ifs,(_Ios_Openmode)pcVar8),
             (abStack_5d8[*(long *)(_ifs + -0x18)] & 5) != 0)) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_15);
            poVar7 = std::operator<<((ostream *)&error_message_15,"Cannot open file ");
            std::operator<<(poVar7,pcVar8);
            std::__cxx11::string::string
                      ((string *)&analysis,"plp",(allocator *)&waveform_to_spectrum);
            sptk::PrintErrorMessage((string *)&analysis,&error_message_15);
            std::__cxx11::string::~string((string *)&analysis);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_15);
            iVar5 = 1;
            goto LAB_0010599a;
          }
          cVar4 = std::__basic_file<char>::is_open();
          if (cVar4 == '\0') {
            this = (ostringstream *)&std::cin;
          }
          sptk::SpectrumToSpectrum::SpectrumToSpectrum
                    (&spectrum_to_spectrum,fft_length,input_format,kPowerSpectrum,0.0,
                     -1.79769313486232e+308);
          if ((input_format != kNumInputOutputFormats) && (spectrum_to_spectrum.is_valid_ == false))
          {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_15);
            std::operator<<((ostream *)&error_message_15,
                            "Failed to set condition for input formatting");
            std::__cxx11::string::string
                      ((string *)&analysis,"plp",(allocator *)&waveform_to_spectrum);
            sptk::PrintErrorMessage((string *)&analysis,&error_message_15);
            std::__cxx11::string::~string((string *)&analysis);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_15);
            iVar5 = 1;
            goto LAB_0010598d;
          }
          sptk::WaveformToSpectrum::WaveformToSpectrum
                    (&waveform_to_spectrum,fft_length,fft_length,kPowerSpectrum,0.0,
                     -1.79769313486232e+308);
          buffer_for_spectral_analysis._vptr_Buffer = (_func_int **)&PTR__Buffer_00118540;
          buffer_for_spectral_analysis.buffer_._vptr_Buffer = (_func_int **)&PTR__Buffer_00118570;
          buffer_for_spectral_analysis.buffer_.fast_fourier_transform_buffer_._vptr_Buffer =
               (_func_int **)&PTR__Buffer_001185a0;
          memset(&buffer_for_spectral_analysis.buffer_.fast_fourier_transform_buffer_.
                  real_part_input_,0,0xa8);
          if ((input_format == kNumInputOutputFormats) &&
             (waveform_to_spectrum.filter_coefficients_to_spectrum_.is_valid_ == false)) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_15);
            std::operator<<((ostream *)&error_message_15,
                            "Failed to set condition for spectral analysis");
            std::__cxx11::string::string
                      ((string *)&analysis,"plp",(allocator *)&buffer_for_plp_analysis);
            sptk::PrintErrorMessage((string *)&analysis,&error_message_15);
            std::__cxx11::string::~string((string *)&analysis);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_15);
            iVar5 = 1;
            goto LAB_00105973;
          }
          sptk::PerceptualLinearPredictiveCoefficientsAnalysis::
          PerceptualLinearPredictiveCoefficientsAnalysis
                    (&analysis,fft_length,num_channel,num_order,liftering_coefficient,
                     compression_factor,sampling_rate_00,lowest_frequency,highest_frequency,floor);
          buffer_for_plp_analysis._vptr_Buffer = (_func_int **)&PTR__Buffer_001185d0;
          memset(&buffer_for_plp_analysis.filter_bank_output_,0,0xa8);
          buffer_for_plp_analysis.buffer_for_levinson_durbin_recursion_._vptr_Buffer =
               (_func_int **)&PTR__Buffer_00118600;
          buffer_for_plp_analysis.buffer_for_levinson_durbin_recursion_.c_.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          buffer_for_plp_analysis.buffer_for_levinson_durbin_recursion_.c_.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          buffer_for_plp_analysis.buffer_for_levinson_durbin_recursion_.c_.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          if (analysis.is_valid_ == false) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_15);
            std::operator<<((ostream *)&error_message_15,"Failed to set condition for PLP analysis")
            ;
            std::__cxx11::string::string((string *)&local_820,"plp",(allocator *)&input);
            sptk::PrintErrorMessage(&local_820,&error_message_15);
            std::__cxx11::string::~string((string *)&local_820);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_15);
            iVar5 = 1;
            goto LAB_00105959;
          }
          read_size = fft_length;
          if (input_format != kNumInputOutputFormats) {
            read_size = fft_length / 2 + 1;
          }
          local_800 = (ulong)num_order;
          std::vector<double,_std::allocator<double>_>::vector
                    (&input,(long)read_size,(allocator_type *)&error_message_15);
          std::vector<double,_std::allocator<double>_>::vector
                    (&processed_input,(long)(fft_length / 2 + 1),(allocator_type *)&error_message_15
                    );
          std::vector<double,_std::allocator<double>_>::vector
                    (&output,local_800,(allocator_type *)&error_message_15);
          energy = 0.0;
          uVar9 = (uint)local_7f0 & 0xfffffffd;
          energy_00 = &energy;
          if (uVar9 != 1) {
            energy_00 = (double *)0x0;
          }
          local_7f0 = (ulong)((uint)local_7f0 & 0xfffffffe);
          iVar5 = 1;
          goto LAB_001054e0;
        }
        std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_15);
        bVar2 = sptk::ConvertStringToDouble((string *)&ifs,&lowest_frequency);
        bVar3 = lowest_frequency < 0.0;
        std::__cxx11::string::~string((string *)&ifs);
        if (!bVar2 || bVar3) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
          poVar7 = std::operator<<((ostream *)&ifs,"The argument for the -L option must be a ");
          std::operator<<(poVar7,"non-negative number");
          std::__cxx11::string::string((string *)&error_message_15,"plp",(allocator *)&analysis);
          sptk::PrintErrorMessage((string *)&error_message_15,(ostringstream *)&ifs);
          goto LAB_00105182;
        }
      }
    }
  } while( true );
LAB_001054e0:
  do {
    bVar3 = sptk::ReadStream<double>(false,0,0,read_size,&input,(istream *)this,(int *)0x0);
    if (!bVar3) {
      iVar5 = 0;
      goto LAB_00105932;
    }
    if (local_830 == kNumInputOutputFormats) {
      bVar3 = sptk::WaveformToSpectrum::Run
                        (&waveform_to_spectrum,&input,&processed_input,&buffer_for_spectral_analysis
                        );
      if (!bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_15);
        std::operator<<((ostream *)&error_message_15,"Failed to transform waveform to spectrum");
        std::__cxx11::string::string((string *)&local_820,"plp",&local_835);
        sptk::PrintErrorMessage(&local_820,&error_message_15);
        goto LAB_0010591b;
      }
    }
    else {
      bVar3 = sptk::SpectrumToSpectrum::Run(&spectrum_to_spectrum,&input,&processed_input);
      if (!bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_15);
        std::operator<<((ostream *)&error_message_15,"Failed to convert spectrum");
        std::__cxx11::string::string((string *)&local_820,"plp",&local_835);
        sptk::PrintErrorMessage(&local_820,&error_message_15);
        goto LAB_0010591b;
      }
    }
    bVar3 = sptk::PerceptualLinearPredictiveCoefficientsAnalysis::Run
                      (&analysis,&processed_input,&output,energy_00,&buffer_for_plp_analysis);
    if (!bVar3) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_15);
      std::operator<<((ostream *)&error_message_15,"Failed to run PLP analysis");
      std::__cxx11::string::string((string *)&local_820,"plp",&local_835);
      sptk::PrintErrorMessage(&local_820,&error_message_15);
      goto LAB_0010591b;
    }
    bVar3 = sptk::WriteStream<double>(1,(int)local_800,&output,(ostream *)&std::cout,(int *)0x0);
    if (!bVar3) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_15);
      std::operator<<((ostream *)&error_message_15,"Failed to write PLP");
      std::__cxx11::string::string((string *)&local_820,"plp",&local_835);
      sptk::PrintErrorMessage(&local_820,&error_message_15);
      goto LAB_0010591b;
    }
    if (((int)local_7f0 == 2) &&
       (bVar3 = sptk::WriteStream<double>
                          (*output.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start,(ostream *)&std::cout), !bVar3)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_15);
      std::operator<<((ostream *)&error_message_15,"Failed to write c0");
      std::__cxx11::string::string((string *)&local_820,"plp",&local_835);
      sptk::PrintErrorMessage(&local_820,&error_message_15);
      goto LAB_0010591b;
    }
  } while ((uVar9 != 1) || (bVar3 = sptk::WriteStream<double>(energy,(ostream *)&std::cout), bVar3))
  ;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_15);
  std::operator<<((ostream *)&error_message_15,"Failed to write energy");
  std::__cxx11::string::string((string *)&local_820,"plp",&local_835);
  sptk::PrintErrorMessage(&local_820,&error_message_15);
LAB_0010591b:
  std::__cxx11::string::~string((string *)&local_820);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_15);
LAB_00105932:
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&output.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&processed_input.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&input.super__Vector_base<double,_std::allocator<double>_>);
LAB_00105959:
  sptk::PerceptualLinearPredictiveCoefficientsAnalysis::Buffer::~Buffer(&buffer_for_plp_analysis);
  sptk::PerceptualLinearPredictiveCoefficientsAnalysis::
  ~PerceptualLinearPredictiveCoefficientsAnalysis(&analysis);
LAB_00105973:
  sptk::WaveformToSpectrum::Buffer::~Buffer(&buffer_for_spectral_analysis);
  sptk::WaveformToSpectrum::~WaveformToSpectrum(&waveform_to_spectrum);
LAB_0010598d:
  sptk::SpectrumToSpectrum::~SpectrumToSpectrum(&spectrum_to_spectrum);
LAB_0010599a:
  std::ifstream::~ifstream(&ifs);
  return iVar5;
}

Assistant:

int main(int argc, char* argv[]) {
  int num_channel(kDefaultNumChannel);
  int num_order(kDefaultNumOrder);
  int fft_length(kDefaultFftLength);
  int liftering_coefficient(kDefaultLifteringCoefficient);
  double compression_factor(kDefaultCompressionFactor);
  double sampling_rate(kDefaultSamplingRate);
  double lowest_frequency(kDefaultLowestFrequency);
  double highest_frequency(0.0);
  bool is_highest_frequency_specified(false);
  InputFormats input_format(kDefaultInputFormat);
  OutputFormats output_format(kDefaultOutputFormat);
  double floor(kDefaultFloor);

  for (;;) {
    const int option_char(
        getopt_long(argc, argv, "n:m:l:c:f:s:L:H:q:o:e:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'n': {
        if (!sptk::ConvertStringToInteger(optarg, &num_channel) ||
            num_channel <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -n option must be a positive integer";
          sptk::PrintErrorMessage("plp", error_message);
          return 1;
        }
        break;
      }
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &num_order) ||
            num_order <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -m option must be a positive integer";
          sptk::PrintErrorMessage("plp", error_message);
          return 1;
        }
        break;
      }
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &fft_length)) {
          std::ostringstream error_message;
          error_message << "The argument for the -l option must be an integer";
          sptk::PrintErrorMessage("plp", error_message);
          return 1;
        }
        break;
      }
      case 'c': {
        if (!sptk::ConvertStringToInteger(optarg, &liftering_coefficient) ||
            liftering_coefficient <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -c option must be a positive integer";
          sptk::PrintErrorMessage("plp", error_message);
          return 1;
        }
        break;
      }
      case 'f': {
        if (!sptk::ConvertStringToDouble(optarg, &compression_factor) ||
            compression_factor <= 0.0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -f option must be a positive number";
          sptk::PrintErrorMessage("plp", error_message);
          return 1;
        }
        break;
      }
      case 's': {
        if (!sptk::ConvertStringToDouble(optarg, &sampling_rate) ||
            sampling_rate <= 0.0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -s option must be a positive number";
          sptk::PrintErrorMessage("plp", error_message);
          return 1;
        }
        break;
      }
      case 'L': {
        if (!sptk::ConvertStringToDouble(optarg, &lowest_frequency) ||
            lowest_frequency < 0.0) {
          std::ostringstream error_message;
          error_message << "The argument for the -L option must be a "
                        << "non-negative number";
          sptk::PrintErrorMessage("plp", error_message);
          return 1;
        }
        break;
      }
      case 'H': {
        if (!sptk::ConvertStringToDouble(optarg, &highest_frequency) ||
            highest_frequency <= 0.0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -H option must be a positive number";
          sptk::PrintErrorMessage("plp", error_message);
          return 1;
        }
        is_highest_frequency_specified = true;
        break;
      }
      case 'q': {
        const int min(0);
        const int max(static_cast<int>(kNumInputFormats) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -q option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("plp", error_message);
          return 1;
        }
        input_format = static_cast<InputFormats>(tmp);
        break;
      }
      case 'o': {
        const int min(0);
        const int max(static_cast<int>(kNumOutputFormats) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -o option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("plp", error_message);
          return 1;
        }
        output_format = static_cast<OutputFormats>(tmp);
        break;
      }
      case 'e': {
        if (!sptk::ConvertStringToDouble(optarg, &floor) || floor <= 0.0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -e option must be a positive number";
          sptk::PrintErrorMessage("plp", error_message);
          return 1;
        }
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const double sampling_rate_in_hz(1000.0 * sampling_rate);
  if (!is_highest_frequency_specified) {
    highest_frequency = 0.5 * sampling_rate_in_hz;
  } else if (0.5 * sampling_rate_in_hz < highest_frequency) {
    std::ostringstream error_message;
    error_message
        << "Highest frequency must be less than or equal to Nyquist frequency";
    sptk::PrintErrorMessage("plp", error_message);
    return 1;
  }

  if (highest_frequency <= lowest_frequency) {
    std::ostringstream error_message;
    error_message << "Lowest frequency must be less than highest one";
    sptk::PrintErrorMessage("plp", error_message);
    return 1;
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("plp", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("plp", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("plp", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  sptk::SpectrumToSpectrum spectrum_to_spectrum(
      fft_length,
      static_cast<sptk::SpectrumToSpectrum::InputOutputFormats>(input_format),
      sptk::SpectrumToSpectrum::InputOutputFormats::kPowerSpectrum);
  if (kWaveform != input_format && !spectrum_to_spectrum.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to set condition for input formatting";
    sptk::PrintErrorMessage("plp", error_message);
    return 1;
  }

  sptk::WaveformToSpectrum waveform_to_spectrum(
      fft_length, fft_length,
      sptk::SpectrumToSpectrum::InputOutputFormats::kPowerSpectrum);
  sptk::WaveformToSpectrum::Buffer buffer_for_spectral_analysis;
  if (kWaveform == input_format && !waveform_to_spectrum.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to set condition for spectral analysis";
    sptk::PrintErrorMessage("plp", error_message);
    return 1;
  }

  sptk::PerceptualLinearPredictiveCoefficientsAnalysis analysis(
      fft_length, num_channel, num_order, liftering_coefficient,
      compression_factor, sampling_rate_in_hz, lowest_frequency,
      highest_frequency, floor);
  sptk::PerceptualLinearPredictiveCoefficientsAnalysis::Buffer
      buffer_for_plp_analysis;
  if (!analysis.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to set condition for PLP analysis";
    sptk::PrintErrorMessage("plp", error_message);
    return 1;
  }

  const int input_length(kWaveform == input_format ? fft_length
                                                   : fft_length / 2 + 1);
  const int output_length(num_order);
  std::vector<double> input(input_length);
  std::vector<double> processed_input(fft_length / 2 + 1);
  std::vector<double> output(output_length);
  double energy(0.0);

  while (sptk::ReadStream(false, 0, 0, input_length, &input, &input_stream,
                          NULL)) {
    if (kWaveform != input_format) {
      if (!spectrum_to_spectrum.Run(input, &processed_input)) {
        std::ostringstream error_message;
        error_message << "Failed to convert spectrum";
        sptk::PrintErrorMessage("plp", error_message);
        return 1;
      }
    } else {
      if (!waveform_to_spectrum.Run(input, &processed_input,
                                    &buffer_for_spectral_analysis)) {
        std::ostringstream error_message;
        error_message << "Failed to transform waveform to spectrum";
        sptk::PrintErrorMessage("plp", error_message);
        return 1;
      }
    }

    if (!analysis.Run(processed_input, &output,
                      (kPlpAndEnergy == output_format ||
                       kPlpAndC0AndEnergy == output_format)
                          ? &energy
                          : NULL,
                      &buffer_for_plp_analysis)) {
      std::ostringstream error_message;
      error_message << "Failed to run PLP analysis";
      sptk::PrintErrorMessage("plp", error_message);
      return 1;
    }

    if (!sptk::WriteStream(1, output_length, output, &std::cout, NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write PLP";
      sptk::PrintErrorMessage("plp", error_message);
      return 1;
    }

    if (kPlpAndC0 == output_format || kPlpAndC0AndEnergy == output_format) {
      if (!sptk::WriteStream(output[0], &std::cout)) {
        std::ostringstream error_message;
        error_message << "Failed to write c0";
        sptk::PrintErrorMessage("plp", error_message);
        return 1;
      }
    }

    if (kPlpAndEnergy == output_format || kPlpAndC0AndEnergy == output_format) {
      if (!sptk::WriteStream(energy, &std::cout)) {
        std::ostringstream error_message;
        error_message << "Failed to write energy";
        sptk::PrintErrorMessage("plp", error_message);
        return 1;
      }
    }
  }

  return 0;
}